

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O0

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *s,
          Control<float> *u)

{
  bool bVar1;
  Covariance<KalmanExamples::Robot1::State<float>_> *noiseCov;
  State *pSVar2;
  State<float> local_2c;
  Control<float> *local_20;
  Control<float> *u_local;
  SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *s_local;
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *this_local;
  
  local_20 = u;
  u_local = (Control<float> *)s;
  s_local = (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *)this;
  bVar1 = UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::computeSigmaPoints
                    ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this);
  if (!bVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/include/kalman/UnscentedKalmanFilter.hpp"
                  ,0x87,
                  "const State &Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::predict(const SystemModelType<Control, CovarianceBase> &, const Control &) [StateType = KalmanExamples::Robot1::State<float>, Control = KalmanExamples::Robot1::Control<float>, CovarianceBase = Kalman::StandardBase]"
                 );
  }
  UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>>::
  computeStatePrediction<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
            ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>> *)&local_2c,
             (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *)this,
             u_local);
  KalmanExamples::Robot1::State<float>::operator=((State<float> *)this,&local_2c);
  noiseCov = StandardBase<KalmanExamples::Robot1::State<float>_>::getCovariance
                       ((StandardBase<KalmanExamples::Robot1::State<float>_> *)(u_local + 1));
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
  computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::State<float>_>
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
             (State<float> *)this,
             (SigmaPoints<KalmanExamples::Robot1::State<float>_> *)(this + 0x44),noiseCov,
             (Covariance<KalmanExamples::Robot1::State<float>_> *)(this + 0xac));
  pSVar2 = KalmanFilterBase<KalmanExamples::Robot1::State<float>_>::getState
                     ((KalmanFilterBase<KalmanExamples::Robot1::State<float>_> *)this);
  return pSVar2;
}

Assistant:

const State& predict( const SystemModelType<Control, CovarianceBase>& s, const Control& u )
        {
            // Compute sigma points
            if(!computeSigmaPoints())
            {
                // TODO: handle numerical error
                assert(false);
            }
            
            // Compute predicted state
            x = this->template computeStatePrediction<Control, CovarianceBase>(s, u);
            
            // Compute predicted covariance
            computeCovarianceFromSigmaPoints(x, sigmaStatePoints, s.getCovariance(), P);
            
            // Return predicted state
            return this->getState();
        }